

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

void opj_destroy_compress(opj_cinfo_t *cinfo)

{
  if (cinfo != (opj_cinfo_t *)0x0) {
    if (cinfo->codec_format == CODEC_JP2) {
      jp2_destroy_compress((opj_jp2_t *)cinfo->jp2_handle);
    }
    else if (cinfo->codec_format == CODEC_J2K) {
      j2k_destroy_compress((opj_j2k_t *)cinfo->j2k_handle);
    }
    free(cinfo);
    return;
  }
  return;
}

Assistant:

void OPJ_CALLCONV opj_destroy_compress(opj_cinfo_t *cinfo) {
	if(cinfo) {
		/* destroy the codec */
		switch(cinfo->codec_format) {
			case CODEC_J2K:
				j2k_destroy_compress((opj_j2k_t*)cinfo->j2k_handle);
				break;
			case CODEC_JP2:
				jp2_destroy_compress((opj_jp2_t*)cinfo->jp2_handle);
				break;
			case CODEC_JPT:
			case CODEC_UNKNOWN:
			default:
				break;
		}
		/* destroy the decompressor */
		opj_free(cinfo);
	}
}